

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioFunc.c
# Opt level: O2

int Mio_GateParseFormula(Mio_Gate_t *pGate)

{
  char **ppcVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  uint Lit;
  uint uVar5;
  uint uVar6;
  Mio_Pin_t *pMVar7;
  Mio_Pin_t *pMVar8;
  Vec_Int_t *pVVar9;
  char *pcVar10;
  word *pwVar11;
  word wVar12;
  word wVar13;
  void *__ptr;
  long lVar14;
  long lVar15;
  Mio_Library_t *puNodes;
  char *pcVar16;
  void *pvVar17;
  ulong uVar18;
  void *pvVar19;
  int iVar20;
  char *__format;
  int i;
  void *pvVar21;
  ulong uVar22;
  Mio_Pin_t *pMVar23;
  word (*__dest) [4];
  long alStack_7b8 [8];
  char *pPinNames [100];
  word Truth8 [8] [4];
  char *pPinNamesCopy [100];
  
  pGate->dDelayMax = 0.0;
  pMVar7 = Mio_GateReadPins(pGate);
  iVar20 = 0;
  while (pMVar7 != (Mio_Pin_t *)0x0) {
    dVar2 = pMVar7->dDelayBlockMax;
    if (pGate->dDelayMax <= dVar2 && dVar2 != pGate->dDelayMax) {
      pGate->dDelayMax = dVar2;
    }
    pMVar7 = Mio_PinReadNext(pMVar7);
    iVar20 = iVar20 + -1;
  }
  pcVar10 = pGate->pForm;
  if (iVar20 == 0) {
    pcVar16 = pcVar10;
    iVar20 = strcmp(pcVar10,"CONST0");
    if (iVar20 == 0) {
      pVVar9 = Vec_IntAlloc((int)pcVar16);
      Vec_IntPush(pVVar9,-1);
      pGate->vExpr = pVVar9;
      pcVar10 = Mio_SopRegister(pGate->pLib->pMmFlex," 0\n");
      pGate->pSop = pcVar10;
      (pGate->field_15).uTruth = 0;
      pGate->pLib->pGate0 = pGate;
    }
    else {
      pcVar16 = pcVar10;
      iVar20 = strcmp(pcVar10,"CONST1");
      if (iVar20 != 0) {
        pcVar16 = pGate->pName;
        __format = "Cannot parse formula \"%s\" of gate \"%s\".\n";
        goto LAB_006ed518;
      }
      pVVar9 = Vec_IntAlloc((int)pcVar16);
      Vec_IntPush(pVVar9,-2);
      pGate->vExpr = pVVar9;
      pcVar10 = Mio_SopRegister(pGate->pLib->pMmFlex," 1\n");
      pGate->pSop = pcVar10;
      (pGate->field_15).uTruth = 0xffffffffffffffff;
      pGate->pLib->pGate1 = pGate;
    }
LAB_006ed788:
    iVar20 = 0;
  }
  else {
    uVar3 = Mio_GateCollectNames(pcVar10,pPinNames);
    if (uVar3 == 0) {
      pcVar16 = pGate->pName;
      pcVar10 = pGate->pForm;
      __format = "Cannot read formula \"%s\" of gate \"%s\".\n";
LAB_006ed518:
      printf(__format,pcVar10,pcVar16);
    }
    else {
      pGate->nInputs = uVar3;
      pMVar7 = pGate->pPins;
      pcVar10 = pMVar7->pName;
      if ((*pcVar10 == '*') && (pcVar10[1] == '\0')) {
        free(pcVar10);
        pMVar7->pName = (char *)0x0;
        pMVar23 = pMVar7;
        for (lVar15 = 1; lVar15 < (int)uVar3; lVar15 = lVar15 + 1) {
          pMVar8 = Mio_PinDup(pMVar7);
          pMVar23->pNext = pMVar8;
          pMVar8->pName = pPinNames[lVar15];
          pMVar23 = pMVar23->pNext;
        }
        pMVar23->pNext = (Mio_Pin_t *)0x0;
        pMVar7->pName = pPinNames[0];
LAB_006ed60d:
        pVVar9 = Mio_ParseFormula(pGate->pForm,pPinNames,uVar3);
        pGate->vExpr = pVVar9;
        pcVar10 = Mio_LibDeriveSop(uVar3,pVVar9,pGate->pLib->vCube);
        pGate->pSop = pcVar10;
        puNodes = pGate->pLib;
        pcVar10 = Mio_SopRegister(puNodes->pMmFlex,pcVar10);
        pGate->pSop = pcVar10;
        if ((int)uVar3 < 7) {
          pVVar9 = pGate->vExpr;
          iVar20 = pVVar9->nSize;
          pwVar11 = (word *)calloc((long)(iVar20 / 2),8);
          iVar4 = 0;
          for (lVar15 = 0; lVar15 < iVar20 / 2; lVar15 = lVar15 + 1) {
            iVar20 = Vec_IntEntry(pVVar9,iVar4);
            wVar12 = Exp_Truth6Lit(uVar3,iVar20,pwVar11,(word *)puNodes);
            iVar20 = Vec_IntEntry(pVVar9,iVar4 + 1);
            wVar13 = Exp_Truth6Lit(uVar3,iVar20,pwVar11,(word *)puNodes);
            pwVar11[lVar15] = wVar13 & wVar12;
            iVar20 = pVVar9->nSize;
            iVar4 = iVar4 + 2;
          }
          iVar20 = Vec_IntEntryLast(pVVar9);
          wVar12 = Exp_Truth6Lit(uVar3,iVar20,pwVar11,(word *)puNodes);
          free(pwVar11);
          (pGate->field_15).uTruth = wVar12;
        }
        else {
          if (8 < uVar3) {
            return 0;
          }
          pwVar11 = (word *)calloc(4,8);
          (pGate->field_15).pTruth = pwVar11;
          pVVar9 = pGate->vExpr;
          __dest = Truth8;
          memcpy(__dest,&DAT_008804c0,0x100);
          Lit = Vec_IntEntryLast(pVVar9);
          for (lVar15 = 0; lVar15 != 8; lVar15 = lVar15 + 1) {
            alStack_7b8[lVar15] = (long)__dest;
            __dest = __dest + 1;
          }
          iVar20 = pVVar9->nSize;
          if (iVar20 + 1U < 3) {
            if (SBORROW4(Lit,uVar3 * 2) == (int)(Lit + uVar3 * -2) < 0) {
              __assert_fail("iRoot < 2 * nVars",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/exp.h"
                            ,0xe3,"void Exp_Truth8(int, Vec_Int_t *, word **, word *)");
            }
            if (Lit < 0xfffffffe) {
              for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
                iVar20 = Abc_LitIsCompl(Lit);
                uVar3 = Abc_Lit2Var(Lit);
                pwVar11[lVar15] = (long)-iVar20 ^ *(ulong *)(alStack_7b8[uVar3] + lVar15 * 8);
              }
            }
            else {
              for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
                pwVar11[lVar15] = -(ulong)(Lit != 0xffffffff);
              }
            }
          }
          else {
            __ptr = calloc((long)(iVar20 / 2 << 2),8);
            pvVar21 = (void *)0x0;
            pvVar19 = __ptr;
            for (lVar15 = 0; iVar4 = (int)lVar15, lVar15 < iVar20 / 2; lVar15 = lVar15 + 1) {
              iVar20 = Vec_IntEntry(pVVar9,iVar4 * 2);
              uVar5 = Abc_Lit2Var(iVar20);
              i = iVar4 * 2 + 1;
              iVar20 = Vec_IntEntry(pVVar9,i);
              uVar6 = Abc_Lit2Var(iVar20);
              iVar20 = Vec_IntEntry(pVVar9,iVar4 * 2);
              iVar20 = Abc_LitIsCompl(iVar20);
              iVar4 = Vec_IntEntry(pVVar9,i);
              iVar4 = Abc_LitIsCompl(iVar4);
              if ((int)uVar5 < (int)uVar3) {
                pvVar21 = (void *)alStack_7b8[uVar5];
              }
              else {
                pvVar21 = (void *)((long)__ptr + (long)(int)((uVar5 - uVar3) * 4) * 8);
              }
              if ((int)uVar6 < (int)uVar3) {
                pvVar17 = (void *)alStack_7b8[uVar6];
              }
              else {
                pvVar17 = (void *)((long)__ptr + (long)(int)((uVar6 - uVar3) * 4) * 8);
              }
              if (iVar4 == 0 || iVar20 == 0) {
                if (iVar20 == 0 || (byte)iVar4 != 0) {
                  if ((iVar20 == 0 & (byte)iVar4) == 0) {
                    for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                      *(ulong *)((long)pvVar19 + lVar14 * 8) =
                           *(ulong *)((long)pvVar17 + lVar14 * 8) &
                           *(ulong *)((long)pvVar21 + lVar14 * 8);
                    }
                  }
                  else {
                    for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                      *(ulong *)((long)pvVar19 + lVar14 * 8) =
                           ~*(ulong *)((long)pvVar17 + lVar14 * 8) &
                           *(ulong *)((long)pvVar21 + lVar14 * 8);
                    }
                  }
                }
                else {
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    *(ulong *)((long)pvVar19 + lVar14 * 8) =
                         ~*(ulong *)((long)pvVar21 + lVar14 * 8) &
                         *(ulong *)((long)pvVar17 + lVar14 * 8);
                  }
                }
              }
              else {
                for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                  *(ulong *)((long)pvVar19 + lVar14 * 8) =
                       ~(*(ulong *)((long)pvVar17 + lVar14 * 8) |
                        *(ulong *)((long)pvVar21 + lVar14 * 8));
                }
              }
              pvVar21 = (void *)(lVar15 * 0x20 + (long)__ptr);
              iVar20 = pVVar9->nSize;
              pvVar19 = (void *)((long)pvVar19 + 0x20);
            }
            iVar20 = Abc_Lit2Var(Lit);
            if (iVar20 - uVar3 != iVar4 + -1) {
              __assert_fail("Abc_Lit2Var(iRoot) - nVars == i - 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mio/exp.h"
                            ,0x103,"void Exp_Truth8(int, Vec_Int_t *, word **, word *)");
            }
            for (lVar15 = 0; lVar15 != 4; lVar15 = lVar15 + 1) {
              iVar20 = Abc_LitIsCompl(Lit);
              pwVar11[lVar15] = (long)-iVar20 ^ *(ulong *)((long)pvVar21 + lVar15 * 8);
            }
            free(__ptr);
          }
        }
        goto LAB_006ed788;
      }
      pMVar7 = Mio_GateReadPins(pGate);
      uVar18 = 0;
      iVar20 = 0;
      if (0 < (int)uVar3) {
        uVar18 = (ulong)uVar3;
        iVar20 = 0;
      }
      for (; pMVar7 != (Mio_Pin_t *)0x0; pMVar7 = Mio_PinReadNext(pMVar7)) {
        for (uVar22 = 0; uVar18 != uVar22; uVar22 = uVar22 + 1) {
          pcVar10 = pPinNames[uVar22];
          if ((pcVar10 != (char *)0x0) && (iVar4 = strcmp(pcVar10,pMVar7->pName), iVar4 == 0)) {
            free(pcVar10);
            pPinNames[uVar22] = (char *)0x0;
            lVar15 = (long)iVar20;
            iVar20 = iVar20 + 1;
            pPinNamesCopy[lVar15] = pMVar7->pName;
            break;
          }
        }
      }
      uVar22 = 0;
      do {
        if (uVar18 == uVar22) {
          memcpy(pPinNames,pPinNamesCopy,(long)(int)uVar3 << 3);
          goto LAB_006ed60d;
        }
        ppcVar1 = pPinNames + uVar22;
        uVar22 = uVar22 + 1;
      } while (*ppcVar1 == (char *)0x0);
      printf("Name \"%s\" appears in the formula \"%s\" of gate \"%s\" but there is no such pin.\n",
             *ppcVar1,pGate->pForm,pGate->pName);
    }
    iVar20 = 1;
  }
  return iVar20;
}

Assistant:

int Mio_GateParseFormula( Mio_Gate_t * pGate )
{
    char * pPinNames[100];
    char * pPinNamesCopy[100];
    Mio_Pin_t * pPin, ** ppPin;
    int nPins, iPin, i;

    // set the maximum delay of the gate; count pins
    pGate->dDelayMax = 0.0;
    nPins = 0;
    Mio_GateForEachPin( pGate, pPin )
    {
        // set the maximum delay of the gate
        if ( pGate->dDelayMax < pPin->dDelayBlockMax )
            pGate->dDelayMax = pPin->dDelayBlockMax;
        // count the pin
        nPins++;
    }

    // check for the gate with const function
    if ( nPins == 0 )
    {
        if ( strcmp( pGate->pForm, MIO_STRING_CONST0 ) == 0 )
        {
//            pGate->bFunc = b0;
            pGate->vExpr = Exp_Const0();
            pGate->pSop = Mio_SopRegister( (Mem_Flex_t *)pGate->pLib->pMmFlex, " 0\n" );
            pGate->uTruth = 0;
            pGate->pLib->pGate0 = pGate;
        }
        else if ( strcmp( pGate->pForm, MIO_STRING_CONST1 ) == 0 )
        {
//            pGate->bFunc = b1;
            pGate->vExpr = Exp_Const1();
            pGate->pSop = Mio_SopRegister( (Mem_Flex_t *)pGate->pLib->pMmFlex, " 1\n" );
            pGate->uTruth = ~(word)0;
            pGate->pLib->pGate1 = pGate;
        }
        else
        {
            printf( "Cannot parse formula \"%s\" of gate \"%s\".\n", pGate->pForm, pGate->pName );
            return 1;
        }
//        Cudd_Ref( pGate->bFunc );
        return 0;
    }

    // collect the names as they appear in the formula
    nPins = Mio_GateCollectNames( pGate->pForm, pPinNames );
    if ( nPins == 0 )
    {
        printf( "Cannot read formula \"%s\" of gate \"%s\".\n", pGate->pForm, pGate->pName );
        return 1;
    }

    // set the number of inputs
    pGate->nInputs = nPins;

    // consider the case when all the pins have identical pin info
    if ( strcmp( pGate->pPins->pName, "*" ) == 0 )
    {
        // get the topmost (generic) pin
        pPin = pGate->pPins;
        ABC_FREE( pPin->pName );

        // create individual pins from the generic pin
        ppPin = &pPin->pNext;
        for ( i = 1; i < nPins; i++ )
        {
            // get the new pin
            *ppPin = Mio_PinDup( pPin );
            // set its name
            (*ppPin)->pName = pPinNames[i];
            // prepare the next place in the list
            ppPin = &((*ppPin)->pNext);
        }
        *ppPin = NULL;

        // set the name of the topmost pin
        pPin->pName = pPinNames[0];
    }
    else
    {
        // reorder the variable names to appear the save way as the pins
        iPin = 0;
        Mio_GateForEachPin( pGate, pPin )
        {
            // find the pin with the name pPin->pName
            for ( i = 0; i < nPins; i++ )
            {
                if ( pPinNames[i] && strcmp( pPinNames[i], pPin->pName ) == 0 )
                {
                    // free pPinNames[i] because it is already available as pPin->pName
                    // setting pPinNames[i] to NULL is useful to make sure that
                    // this name is not assigned to two pins in the list
                    ABC_FREE( pPinNames[i] );
                    pPinNamesCopy[iPin++] = pPin->pName;
                    break;
                }
                if ( i == nPins )
                {
                    printf( "Cannot find pin name \"%s\" in the formula \"%s\" of gate \"%s\".\n", 
                        pPin->pName, pGate->pForm, pGate->pName );
                    return 1;
                }
            }
        }

        // check for the remaining names
        for ( i = 0; i < nPins; i++ )
            if ( pPinNames[i] )
            {
                printf( "Name \"%s\" appears in the formula \"%s\" of gate \"%s\" but there is no such pin.\n", 
                    pPinNames[i], pGate->pForm, pGate->pName );
                return 1;
            }

        // copy the names back
        memcpy( pPinNames, pPinNamesCopy, nPins * sizeof(char *) );
    }
/*
    // expand the manager if necessary
    if ( dd->size < nPins )
    {
        Cudd_Quit( dd );
        dd = Cudd_Init( nPins + 10, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
        Cudd_zddVarsFromBddVars( dd, 2 );
    }
    // derive formula as the BDD
    pGate->bFunc = Parse_FormulaParser( stdout, pGate->pForm, nPins, 0, pPinNames, dd, dd->vars );
    if ( pGate->bFunc == NULL )
        return 1;
    Cudd_Ref( pGate->bFunc );
    // derive cover
    pGate->pSop = Abc_ConvertBddToSop( pGate->pLib->pMmFlex, dd, pGate->bFunc, pGate->bFunc, nPins, 0, pGate->pLib->vCube, -1 );
*/

    // derive expression 
    pGate->vExpr = Mio_ParseFormula( pGate->pForm, (char **)pPinNames, nPins );
//    Mio_ParseFormulaTruthTest( pGate->pForm, (char **)pPinNames, nPins );
    // derive cover
    pGate->pSop = Mio_LibDeriveSop( nPins, pGate->vExpr, pGate->pLib->vCube );
    pGate->pSop = Mio_SopRegister( (Mem_Flex_t *)pGate->pLib->pMmFlex, pGate->pSop );
    // derive truth table
    if ( nPins <= 6 )
        pGate->uTruth = Exp_Truth6( nPins, pGate->vExpr, NULL );
    else if ( nPins <= 8 )
    {
        pGate->pTruth = ABC_CALLOC( word, 4 );
        Exp_Truth8( nPins, pGate->vExpr, NULL, pGate->pTruth );
    }

/*
    // verify
    if ( pGate->nInputs <= 6 )
    {
        extern word Abc_SopToTruth( char * pSop, int nInputs );
        word t2 = Abc_SopToTruth( pGate->pSop, nPins );
        if ( pGate->uTruth != t2 )
        {
            printf( "%s\n", pGate->pForm );
            Exp_Print( nPins, pGate->vExpr );
            printf( "Verification failed!\n" );
        }
    }
*/
    return 0;
}